

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

EGLConfig deqp::egl::anon_unknown_0::getEGLConfig
                    (Library *egl,EGLDisplay eglDisplay,bool preserveColorBuffer)

{
  FilterList *this;
  EGLConfig pvVar1;
  undefined1 local_38 [8];
  FilterList filters;
  bool preserveColorBuffer_local;
  EGLDisplay eglDisplay_local;
  Library *egl_local;
  
  filters.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = preserveColorBuffer;
  eglu::FilterList::FilterList((FilterList *)local_38);
  this = eglu::FilterList::operator<<((FilterList *)local_38,isWindow);
  eglu::FilterList::operator<<(this,isES2Renderable);
  if ((filters.m_rules.
       super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    eglu::FilterList::operator<<((FilterList *)local_38,hasPreserveSwap);
  }
  pvVar1 = eglu::chooseSingleConfig(egl,eglDisplay,(FilterList *)local_38);
  eglu::FilterList::~FilterList((FilterList *)local_38);
  return pvVar1;
}

Assistant:

EGLConfig getEGLConfig (const Library& egl, EGLDisplay eglDisplay, bool preserveBuffer)
{
	eglu::FilterList filters;

	filters << isWindow << isES2Renderable;
	if (preserveBuffer)
		filters << hasPreserveSwap;

	return eglu::chooseSingleConfig(egl, eglDisplay, filters);
}